

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/linux/test_linux_timer.c"
            );
  UnityDefaultTestRun(test_create_timer,"test_create_timer",0x19b);
  UnityDefaultTestRun(test_create_timer_timerfd_create_fails,
                      "test_create_timer_timerfd_create_fails",0x19c);
  UnityDefaultTestRun(test_create_timer_eventloop_add_fails,"test_create_timer_eventloop_add_fails",
                      0x19d);
  UnityDefaultTestRun(test_create_timer_eventloop_register_read_fails,
                      "test_create_timer_eventloop_register_read_fails",0x19e);
  UnityDefaultTestRun(test_close_without_hook,"test_close_without_hook",0x19f);
  UnityDefaultTestRun(test_close_with_hook,"test_close_with_hook",0x1a0);
  UnityDefaultTestRun(test_eventloop_error,"test_eventloop_error",0x1a1);
  UnityDefaultTestRun(test_close_while_armed,"test_close_while_armed",0x1a2);
  UnityDefaultTestRun(test_cancel_without_arming,"test_cancel_without_arming",0x1a3);
  UnityDefaultTestRun(test_cancel_settime_in_cancel_fails,"test_cancel_settime_in_cancel_fails",
                      0x1a4);
  UnityDefaultTestRun(test_arming_settime_fails,"test_arming_settime_fails",0x1a5);
  UnityDefaultTestRun(test_arming_read_fails,"test_arming_read_fails",0x1a6);
  UnityDefaultTestRun(test_arming_success,"test_arming_success",0x1a7);
  UnityDefaultTestRun(test_close_in_callback,"test_close_in_callback",0x1a8);
  UnityDefaultTestRun(test_cancel_in_callback,"test_cancel_in_callback",0x1a9);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_create_timer);
	RUN_TEST(test_create_timer_timerfd_create_fails);
	RUN_TEST(test_create_timer_eventloop_add_fails);
	RUN_TEST(test_create_timer_eventloop_register_read_fails);
	RUN_TEST(test_close_without_hook);
	RUN_TEST(test_close_with_hook);
	RUN_TEST(test_eventloop_error);
	RUN_TEST(test_close_while_armed);
	RUN_TEST(test_cancel_without_arming);
	RUN_TEST(test_cancel_settime_in_cancel_fails);
	RUN_TEST(test_arming_settime_fails);
	RUN_TEST(test_arming_read_fails);
	RUN_TEST(test_arming_success);
	RUN_TEST(test_close_in_callback);
	RUN_TEST(test_cancel_in_callback);
	return UNITY_END();
}